

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<VmValue_*,_128U>::grow(SmallArray<VmValue_*,_128U> *this,uint newSize)

{
  Allocator *pAVar1;
  VmValue **ppVVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  VmValue **ppVVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = (this->max >> 1) + this->max;
  uVar3 = newSize + 4;
  if (newSize < uVar6) {
    uVar3 = uVar6;
  }
  pAVar1 = this->allocator;
  if (pAVar1 == (Allocator *)0x0) {
    ppVVar5 = (VmValue **)(*(code *)NULLC::alloc)(uVar3 * 8 + 4);
  }
  else {
    iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,(ulong)(uVar3 * 8 + 4));
    ppVVar5 = (VmValue **)CONCAT44(extraout_var,iVar4);
  }
  uVar6 = this->count;
  if ((ulong)uVar6 != 0) {
    uVar7 = 0;
    do {
      ppVVar5[uVar7] = this->data[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  ppVVar2 = this->data;
  if (ppVVar2 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppVVar2 != (VmValue **)0x0) {
        (*(code *)NULLC::dealloc)(ppVVar2);
      }
    }
    else if (ppVVar2 != (VmValue **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = ppVVar5;
  this->max = uVar3;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}